

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  protobuf pVar1;
  bool bVar2;
  undefined1 uVar3;
  LogMessage *pLVar4;
  long lVar5;
  char *pcVar6;
  protobuf pVar7;
  protobuf pVar8;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  LogFinisher local_99;
  StringPiece local_98;
  StringPiece local_88;
  StringPiece local_78;
  StringPiece local_68;
  LogMessage local_58;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x519);
    pLVar4 = internal::LogMessage::operator<<(&local_58,"CHECK failed: value != nullptr: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_99,pLVar4);
    internal::LogMessage::~LogMessage(&local_58);
  }
  switch(s1.length_) {
  case (char *)0x1:
    pcVar6 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x1e0b7e);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) {
        if (s1.length_ == (char *)0x1) goto LAB_001a4a17;
        if (s1.length_ == (char *)0x5) goto switchD_001a4914_caseD_5;
        if (s1.length_ != (char *)0x3) goto switchD_001a4914_caseD_2;
        goto switchD_001a4914_caseD_3;
      }
      pcVar6 = pcVar6 + 1;
    } while (s1.length_ != pcVar6);
    break;
  default:
switchD_001a4914_caseD_2:
    StringPiece::StringPiece(&local_68,"f");
    s1.ptr_ = (char *)this;
    bVar2 = CaseEqual(s1,local_68);
    if (!bVar2) {
      StringPiece::StringPiece(&local_78,"no");
      s1_00.length_ = (stringpiece_ssize_type)s1.length_;
      s1_00.ptr_ = (char *)this;
      bVar2 = CaseEqual(s1_00,local_78);
      if (!bVar2) {
        StringPiece::StringPiece(&local_88,"n");
        s1_01.length_ = (stringpiece_ssize_type)s1.length_;
        s1_01.ptr_ = (char *)this;
        bVar2 = CaseEqual(s1_01,local_88);
        if (!bVar2) {
          StringPiece::StringPiece(&local_98,"0");
          s1_02.length_ = (stringpiece_ssize_type)s1.length_;
          s1_02.ptr_ = (char *)this;
          bVar2 = CaseEqual(s1_02,local_98);
          uVar3 = 0;
          if (!bVar2) {
            return false;
          }
          goto LAB_001a4b94;
        }
      }
    }
    goto LAB_001a4b92;
  case (char *)0x3:
switchD_001a4914_caseD_3:
    pcVar6 = (char *)0x0;
    while( true ) {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x1de551);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) break;
      pcVar6 = pcVar6 + 1;
      if (s1.length_ == pcVar6) goto LAB_001a4a59;
    }
    if (s1.length_ == (char *)0x5) goto switchD_001a4914_caseD_5;
    if (s1.length_ != (char *)0x1) goto switchD_001a4914_caseD_2;
LAB_001a4a17:
    pcVar6 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x1e0f81);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) {
        if (s1.length_ == (char *)0x5) goto switchD_001a4914_caseD_5;
        if (s1.length_ != (char *)0x1) goto switchD_001a4914_caseD_2;
        pVar1 = *this;
        pVar7 = (protobuf)((char)pVar1 + ' ');
        if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
          pVar7 = pVar1;
        }
        uVar3 = 1;
        if (pVar7 == (protobuf)0x31) goto LAB_001a4b94;
        goto switchD_001a4914_caseD_2;
      }
      pcVar6 = pcVar6 + 1;
    } while (s1.length_ != pcVar6);
    break;
  case (char *)0x4:
    lVar5 = 0;
    do {
      pVar1 = this[lVar5];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)("true" + lVar5);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) goto switchD_001a4914_caseD_2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    break;
  case (char *)0x5:
switchD_001a4914_caseD_5:
    pcVar6 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar6];
      pVar7 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar7 = pVar1;
      }
      pVar1 = *(protobuf *)(pcVar6 + 0x1e1944);
      pVar8 = (protobuf)((char)pVar1 + ' ');
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar8 = pVar1;
      }
      if (pVar7 != pVar8) goto switchD_001a4914_caseD_2;
      pcVar6 = pcVar6 + 1;
    } while (s1.length_ != pcVar6);
LAB_001a4b92:
    uVar3 = 0;
    goto LAB_001a4b94;
  }
LAB_001a4a59:
  uVar3 = 1;
LAB_001a4b94:
  *(undefined1 *)str.length_ = uVar3;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}